

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_enc.c
# Opt level: O3

int rateallocate(jpc_enc_t *enc,uint numlyrs,uint_fast32_t *cumlens)

{
  ulong *puVar1;
  jpc_enc_tile_t *pjVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  int iVar10;
  jas_stream_t *stream;
  jpc_enc_tcmpt_t *pjVar11;
  jpc_enc_rlvl_t *pjVar12;
  jpc_enc_band_t *pjVar13;
  jpc_enc_pass_t *pjVar14;
  jpc_enc_pass_t *pjVar15;
  ulong uVar16;
  ulong uVar17;
  jpc_enc_tcmpt_t *pjVar18;
  jpc_enc_pass_t *pjVar19;
  jpc_enc_rlvl_t *pjVar20;
  jpc_enc_band_t *pjVar21;
  ulong uVar22;
  uint uVar23;
  jpc_enc_cblk_t *pjVar24;
  undefined8 uVar25;
  uint uVar26;
  long lVar27;
  jpc_enc_prc_t *pjVar28;
  uint uVar29;
  jpc_enc_pass_t *pjVar30;
  uint *puVar31;
  jpc_enc_pass_t *pjVar32;
  uint uVar33;
  jpc_enc_cblk_t *pjVar34;
  undefined8 uVar35;
  ulong uVar36;
  uint uVar37;
  uint uVar38;
  bool bVar39;
  undefined4 uVar40;
  undefined4 uVar45;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  double dVar51;
  int iVar52;
  double dVar53;
  double dVar54;
  int iVar56;
  undefined1 auVar55 [16];
  double dVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  jpc_enc_tcmpt_t *local_f0;
  jpc_enc_tcmpt_t *local_d8;
  double local_a8;
  double local_90;
  double local_68;
  undefined1 auVar41 [16];
  
  iVar8 = jas_getdbglevel();
  if (9 < iVar8) {
    jas_eprintf("starting rate allocation\n");
  }
  pjVar2 = enc->curtile;
  uVar29 = numlyrs - 1;
  if (1 < uVar29) {
    uVar22 = 1;
    uVar36 = *cumlens;
    do {
      puVar1 = cumlens + uVar22;
      if (*puVar1 < uVar36) {
LAB_00122b55:
        abort();
      }
      uVar22 = uVar22 + 1;
      uVar36 = *puVar1;
    } while (uVar29 != uVar22);
  }
  stream = jas_stream_memopen((char *)0x0,0);
  iVar10 = -1;
  if (stream != (jas_stream_t *)0x0) {
    if ((ulong)pjVar2->numtcmpts == 0) {
      dVar53 = 1.79769313486232e+308;
      dVar54 = 0.0;
    }
    else {
      pjVar18 = pjVar2->tcmpts;
      pjVar11 = pjVar18 + pjVar2->numtcmpts;
      auVar46 = ZEXT816(0x7fefffffffffffff);
      dVar54 = 0.0;
      do {
        if ((ulong)pjVar18->numrlvls != 0) {
          pjVar20 = pjVar18->rlvls;
          pjVar12 = pjVar20 + pjVar18->numrlvls;
          do {
            pjVar21 = pjVar20->bands;
            if ((pjVar21 != (jpc_enc_band_t *)0x0) && ((ulong)pjVar20->numbands != 0)) {
              pjVar13 = pjVar21 + pjVar20->numbands;
              do {
                if ((pjVar21->data != (jas_matrix_t *)0x0) &&
                   (uVar23 = pjVar20->numprcs, uVar23 != 0)) {
                  pjVar28 = pjVar21->prcs;
                  uVar26 = 0;
                  do {
                    pjVar24 = pjVar28->cblks;
                    if ((pjVar24 != (jpc_enc_cblk_t *)0x0) && ((ulong)pjVar28->numcblks != 0)) {
                      pjVar34 = pjVar24 + pjVar28->numcblks;
                      do {
                        uVar36 = (ulong)pjVar24->numpasses;
                        if (uVar36 != 0) {
                          pjVar32 = pjVar24->passes;
                          dVar53 = 0.0;
                          pjVar14 = (jpc_enc_pass_t *)0x0;
                          pjVar19 = pjVar32;
                          pjVar30 = pjVar32;
LAB_00121bf5:
                          do {
                            dVar57 = pjVar19->cumwmsedec;
                            lVar27 = (long)pjVar19->end;
                            if (pjVar14 != (jpc_enc_pass_t *)0x0) {
                              dVar57 = dVar57 - pjVar14->cumwmsedec;
                              lVar27 = lVar27 - pjVar14->end;
                            }
                            if (dVar57 <= 0.0) {
                              pjVar19->rdslope = -1.0;
                              if (pjVar30 <= pjVar19) {
                                pjVar30 = pjVar19 + 1;
                              }
LAB_00121c65:
                              pjVar19 = pjVar19 + 1;
                              if (pjVar19 != pjVar32 + uVar36) goto LAB_00121bf5;
                            }
                            else {
                              if ((pjVar19 < pjVar30) && (pjVar19->rdslope <= 0.0))
                              goto LAB_00121c65;
                              if (lVar27 == 0) {
                                if (pjVar14 == (jpc_enc_pass_t *)0x0) {
                                  __assert_fail("pass0",
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_enc.c"
                                                ,0x5f7,"void calcrdslopes(jpc_enc_cblk_t *)");
                                }
                              }
                              else {
                                dVar57 = dVar57 / (double)lVar27;
                                if ((pjVar14 == (jpc_enc_pass_t *)0x0) || (dVar57 < dVar53)) {
                                  pjVar19->rdslope = dVar57;
                                  pjVar14 = pjVar19;
                                  dVar53 = dVar57;
                                  if (pjVar30 <= pjVar19) {
                                    pjVar30 = pjVar19 + 1;
                                  }
                                  goto LAB_00121c65;
                                }
                              }
                              pjVar14->rdslope = 0.0;
                            }
                            pjVar14 = (jpc_enc_pass_t *)0x0;
                            pjVar19 = pjVar32;
                          } while (pjVar30 != pjVar32 + uVar36);
                          if (uVar36 != 0) {
                            lVar27 = 0;
                            do {
                              dVar53 = *(double *)((long)&pjVar32->rdslope + lVar27);
                              dVar57 = dVar54;
                              if (0.0 < dVar53) {
                                dVar57 = dVar53;
                                if (auVar46._0_8_ <= dVar53) {
                                  dVar57 = auVar46._0_8_;
                                }
                                auVar46._8_8_ = 0;
                                auVar46._0_8_ = dVar57;
                                dVar57 = dVar53;
                                if (dVar53 <= dVar54) {
                                  dVar57 = dVar54;
                                }
                              }
                              dVar54 = dVar57;
                              lVar27 = lVar27 + 0x48;
                            } while (uVar36 * 0x48 != lVar27);
                          }
                        }
                        pjVar24 = pjVar24 + 1;
                      } while (pjVar24 != pjVar34);
                    }
                    uVar26 = uVar26 + 1;
                    pjVar28 = pjVar28 + 1;
                  } while (uVar26 != uVar23);
                }
                pjVar21 = pjVar21 + 1;
              } while (pjVar21 != pjVar13);
            }
            pjVar20 = pjVar20 + 1;
          } while (pjVar20 != pjVar12);
        }
        dVar53 = auVar46._0_8_;
        pjVar18 = pjVar18 + 1;
      } while (pjVar18 != pjVar11);
    }
    if (9 < iVar8) {
      jas_eprintf("min rdslope = %f max rdslope = %f\n",dVar53,dVar54);
    }
    jpc_init_t2state(enc,1);
    if (numlyrs != 0) {
      uVar36 = 0;
      auVar46 = _DAT_0013c1d0;
      auVar60 = _DAT_00139d70;
      auVar61 = _DAT_001384e0;
      do {
        local_a8 = 0.0;
        uVar35 = 0;
        dVar57 = dVar53;
        local_90 = dVar54;
        uVar23 = 0;
        do {
          uVar22 = cumlens[uVar36];
          uVar26 = (uint)uVar36;
          if (uVar22 == 0xffffffffffffffff) {
            if (uVar36 != uVar29) {
              __assert_fail("lyrno == numlyrs - 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_enc.c"
                            ,0x6b0,"int rateallocate(jpc_enc_t *, unsigned int, uint_fast32_t *)");
            }
            uVar25 = 1;
            bVar39 = false;
            local_a8 = -1.0;
            goto LAB_00122470;
          }
          iVar10 = (int)uVar35;
          dVar51 = (local_90 + dVar57) * 0.5;
          jpc_save_t2state(enc);
          lVar27 = jas_stream_tell(stream);
          auVar61 = _DAT_0013c1d0;
          auVar60 = _DAT_00139d70;
          auVar46 = _DAT_001384e0;
          if (lVar27 < 0) {
            __assert_fail("oldpos >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_enc.c"
                          ,0x6bb,"int rateallocate(jpc_enc_t *, unsigned int, uint_fast32_t *)");
          }
          uVar37 = pjVar2->numtcmpts;
          if ((ulong)uVar37 != 0) {
            local_f0 = pjVar2->tcmpts;
            pjVar11 = local_f0 + uVar37;
            pjVar18 = local_f0;
            do {
              if ((ulong)pjVar18->numrlvls != 0) {
                pjVar20 = pjVar18->rlvls;
                pjVar12 = pjVar20 + pjVar18->numrlvls;
                do {
                  pjVar21 = pjVar20->bands;
                  if ((pjVar21 != (jpc_enc_band_t *)0x0) && ((ulong)pjVar20->numbands != 0)) {
                    pjVar13 = pjVar21 + pjVar20->numbands;
                    do {
                      if ((pjVar21->data != (jas_matrix_t *)0x0) &&
                         (uVar38 = pjVar20->numprcs, uVar38 != 0)) {
                        pjVar28 = pjVar21->prcs;
                        uVar33 = 0;
                        do {
                          pjVar24 = pjVar28->cblks;
                          if ((pjVar24 != (jpc_enc_cblk_t *)0x0) && ((ulong)pjVar28->numcblks != 0))
                          {
                            pjVar34 = pjVar24 + pjVar28->numcblks;
                            do {
                              pjVar32 = pjVar24->curpass;
                              if (pjVar32 != (jpc_enc_pass_t *)0x0) {
                                pjVar14 = pjVar24->passes + pjVar24->numpasses;
                                pjVar30 = pjVar32;
                                pjVar19 = pjVar32;
                                if (pjVar32 != pjVar14) {
                                  do {
                                    pjVar15 = pjVar19 + 1;
                                    if (dVar51 <= pjVar19->rdslope) {
                                      pjVar30 = pjVar15;
                                    }
                                    pjVar19 = pjVar15;
                                  } while (pjVar15 != pjVar14);
                                  if (pjVar32 != pjVar30) {
                                    uVar16 = (long)pjVar30 + (-0x48 - (long)pjVar32);
                                    auVar55._8_8_ = 0;
                                    auVar55._0_8_ = uVar16;
                                    uVar40 = SUB164(auVar55 * ZEXT816(0xe38e38e38e38e38f),8);
                                    uVar45 = (undefined4)(uVar16 / 0x120000000);
                                    auVar41._0_8_ = CONCAT44(uVar45,uVar40);
                                    auVar41._8_4_ = uVar40;
                                    auVar41._12_4_ = uVar45;
                                    auVar42._0_8_ = auVar41._0_8_ >> 6;
                                    auVar42._8_8_ = auVar41._8_8_ >> 6;
                                    puVar31 = &pjVar32[3].lyrno;
                                    uVar17 = 0;
                                    do {
                                      auVar47._8_4_ = (int)uVar17;
                                      auVar47._0_8_ = uVar17;
                                      auVar47._12_4_ = (int)(uVar17 >> 0x20);
                                      auVar55 = (auVar47 | auVar60) ^ auVar46;
                                      iVar9 = SUB164(auVar42 ^ auVar46,0);
                                      bVar39 = iVar9 < auVar55._0_4_;
                                      iVar52 = SUB164(auVar42 ^ auVar46,4);
                                      iVar56 = auVar55._4_4_;
                                      if ((bool)(~(iVar52 < iVar56 || iVar56 == iVar52 && bVar39) &
                                                1)) {
                                        puVar31[-0x36] = uVar26;
                                      }
                                      if (iVar52 >= iVar56 && (iVar56 != iVar52 || !bVar39)) {
                                        puVar31[-0x24] = uVar26;
                                      }
                                      auVar55 = (auVar47 | auVar61) ^ auVar46;
                                      iVar56 = auVar55._4_4_;
                                      if (iVar56 <= iVar52 &&
                                          (iVar56 != iVar52 || auVar55._0_4_ <= iVar9)) {
                                        puVar31[-0x12] = uVar26;
                                        *puVar31 = uVar26;
                                      }
                                      uVar17 = uVar17 + 4;
                                      puVar31 = puVar31 + 0x48;
                                      pjVar32 = pjVar30;
                                    } while ((uVar16 / 0x48 + 4 & 0x7fffffffffffffc) != uVar17);
                                  }
                                }
                                if (pjVar32 != pjVar14) {
                                  uVar17 = (long)pjVar14 + (-0x48 - (long)pjVar32);
                                  auVar3._8_8_ = 0;
                                  auVar3._0_8_ = uVar17;
                                  uVar40 = SUB164(auVar3 * ZEXT816(0xe38e38e38e38e38f),8);
                                  uVar45 = (undefined4)(uVar17 / 0x120000000);
                                  auVar43._0_8_ = CONCAT44(uVar45,uVar40);
                                  auVar43._8_4_ = uVar40;
                                  auVar43._12_4_ = uVar45;
                                  auVar44._0_8_ = auVar43._0_8_ >> 6;
                                  auVar44._8_8_ = auVar43._8_8_ >> 6;
                                  puVar31 = &pjVar32[3].lyrno;
                                  uVar16 = 0;
                                  do {
                                    auVar48._8_4_ = (int)uVar16;
                                    auVar48._0_8_ = uVar16;
                                    auVar48._12_4_ = (int)(uVar16 >> 0x20);
                                    auVar55 = (auVar48 | auVar60) ^ auVar46;
                                    iVar9 = SUB164(auVar44 ^ auVar46,0);
                                    bVar39 = iVar9 < auVar55._0_4_;
                                    iVar52 = SUB164(auVar44 ^ auVar46,4);
                                    iVar56 = auVar55._4_4_;
                                    if ((bool)(~(iVar52 < iVar56 || iVar56 == iVar52 && bVar39) & 1)
                                       ) {
                                      puVar31[-0x36] = 0xffffffff;
                                    }
                                    if (iVar52 >= iVar56 && (iVar56 != iVar52 || !bVar39)) {
                                      puVar31[-0x24] = 0xffffffff;
                                    }
                                    auVar55 = (auVar48 | auVar61) ^ auVar46;
                                    iVar56 = auVar55._4_4_;
                                    if (iVar56 <= iVar52 &&
                                        (iVar56 != iVar52 || auVar55._0_4_ <= iVar9)) {
                                      puVar31[-0x12] = 0xffffffff;
                                      *puVar31 = 0xffffffff;
                                    }
                                    uVar16 = uVar16 + 4;
                                    puVar31 = puVar31 + 0x48;
                                  } while ((uVar17 / 0x48 + 4 & 0x7fffffffffffffc) != uVar16);
                                }
                              }
                              pjVar24 = pjVar24 + 1;
                            } while (pjVar24 != pjVar34);
                          }
                          uVar33 = uVar33 + 1;
                          pjVar28 = pjVar28 + 1;
                        } while (uVar33 != uVar38);
                      }
                      pjVar21 = pjVar21 + 1;
                    } while (pjVar21 != pjVar13);
                  }
                  pjVar20 = pjVar20 + 1;
                } while (pjVar20 != pjVar12);
              }
              pjVar18 = pjVar18 + 1;
            } while (pjVar18 != pjVar11);
            if (uVar37 != 0) {
              do {
                if ((ulong)local_f0->numrlvls != 0) {
                  pjVar20 = local_f0->rlvls;
                  pjVar12 = pjVar20 + local_f0->numrlvls;
                  do {
                    if ((pjVar20->bands != (jpc_enc_band_t *)0x0) && (pjVar20->numprcs != 0)) {
                      uVar37 = 0;
                      do {
                        iVar9 = jpc_enc_encpkt(enc,stream,
                                               (int)((ulong)((long)local_f0 - (long)pjVar2->tcmpts)
                                                    >> 3) * -0x55ee191,
                                               (int)((ulong)((long)pjVar20 - (long)local_f0->rlvls)
                                                    >> 3) * -0x3b13b13b,uVar37,uVar26);
                        if (iVar9 != 0) {
                          return -1;
                        }
                        uVar37 = uVar37 + 1;
                      } while (uVar37 < pjVar20->numprcs);
                    }
                    pjVar20 = pjVar20 + 1;
                  } while (pjVar20 != pjVar12);
                }
                local_f0 = local_f0 + 1;
              } while (local_f0 != pjVar11);
            }
          }
          uVar16 = jas_stream_tell(stream);
          if ((long)uVar16 < 0) {
            __assert_fail("pos >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_enc.c"
                          ,0x6fd,"int rateallocate(jpc_enc_t *, unsigned int, uint_fast32_t *)");
          }
          local_68 = dVar51;
          if ((uVar16 <= uVar22) &&
             ((uVar35 = 1, local_90 = dVar51, local_68 = dVar57, iVar10 == 0 || (dVar51 < local_a8))
             )) {
            local_a8 = dVar51;
          }
          jpc_restore_t2state(enc);
          lVar27 = jas_stream_seek(stream,lVar27,0);
          if (lVar27 < 0) goto LAB_00122b55;
          if (9 < iVar8) {
            jas_eprintf("maxlen=%08ld actuallen=%08ld thresh=%f\n",dVar51,uVar22,uVar16);
          }
          auVar46 = _DAT_0013c1d0;
          auVar60 = _DAT_00139d70;
          auVar61 = _DAT_001384e0;
        } while ((local_68 < local_90 + -0.001) &&
                (bVar39 = uVar23 < 0x1f, dVar57 = local_68, uVar23 = uVar23 + 1, bVar39));
        uVar25 = 0;
        if ((int)uVar35 == 0) {
          jas_eprintf("warning: empty layer generated\n");
          bVar39 = true;
          auVar46 = _DAT_0013c1d0;
          auVar60 = _DAT_00139d70;
          auVar61 = _DAT_001384e0;
        }
        else {
          bVar39 = false;
          uVar25 = uVar35;
        }
LAB_00122470:
        if (9 < iVar8) {
          jas_eprintf("success %d goodthresh %f\n",uVar25);
          auVar46 = _DAT_0013c1d0;
          auVar60 = _DAT_00139d70;
          auVar61 = _DAT_001384e0;
        }
        uVar23 = pjVar2->numtcmpts;
        if ((ulong)uVar23 != 0) {
          local_d8 = pjVar2->tcmpts;
          pjVar11 = local_d8 + uVar23;
          pjVar18 = local_d8;
          do {
            if ((ulong)pjVar18->numrlvls != 0) {
              pjVar20 = pjVar18->rlvls;
              pjVar12 = pjVar20 + pjVar18->numrlvls;
              do {
                pjVar21 = pjVar20->bands;
                if ((pjVar21 != (jpc_enc_band_t *)0x0) && ((ulong)pjVar20->numbands != 0)) {
                  pjVar13 = pjVar21 + pjVar20->numbands;
                  do {
                    if ((pjVar21->data != (jas_matrix_t *)0x0) &&
                       (uVar37 = pjVar20->numprcs, uVar37 != 0)) {
                      pjVar28 = pjVar21->prcs;
                      uVar38 = 0;
                      do {
                        pjVar24 = pjVar28->cblks;
                        if ((pjVar24 != (jpc_enc_cblk_t *)0x0) && ((ulong)pjVar28->numcblks != 0)) {
                          pjVar34 = pjVar24 + pjVar28->numcblks;
                          do {
                            pjVar32 = pjVar24->curpass;
                            if (pjVar32 != (jpc_enc_pass_t *)0x0) {
                              pjVar14 = pjVar24->passes + pjVar24->numpasses;
                              pjVar30 = pjVar32;
                              pjVar19 = pjVar32;
                              if (pjVar32 != pjVar14 && !bVar39) {
                                do {
                                  pjVar15 = pjVar19 + 1;
                                  if (local_a8 <= pjVar19->rdslope) {
                                    pjVar30 = pjVar15;
                                  }
                                  pjVar19 = pjVar15;
                                } while (pjVar15 != pjVar14);
                                if (pjVar32 != pjVar30) {
                                  uVar22 = (long)pjVar30 + (-0x48 - (long)pjVar32);
                                  auVar4._8_8_ = 0;
                                  auVar4._0_8_ = uVar22;
                                  uVar40 = SUB164(auVar4 * ZEXT816(0xe38e38e38e38e38f),8);
                                  uVar33 = (uint)(uVar22 / 0x120000000);
                                  puVar31 = &pjVar32[3].lyrno;
                                  uVar16 = 0;
                                  do {
                                    auVar49._8_4_ = (int)uVar16;
                                    auVar49._0_8_ = uVar16;
                                    auVar49._12_4_ = (int)(uVar16 >> 0x20);
                                    auVar7._4_4_ = uVar33 >> 6;
                                    auVar7._0_4_ = (int)(CONCAT44(uVar33,uVar40) >> 6);
                                    auVar7._8_4_ = (int)(CONCAT44(uVar33,uVar40) >> 6);
                                    auVar7._12_4_ = uVar33 >> 6;
                                    auVar55 = (auVar49 | auVar60) ^ auVar61;
                                    iVar10 = SUB164(auVar7 ^ auVar61,0);
                                    bVar6 = iVar10 < auVar55._0_4_;
                                    iVar9 = SUB164(auVar7 ^ auVar61,4);
                                    iVar52 = auVar55._4_4_;
                                    if ((bool)(~(iVar9 < iVar52 || iVar52 == iVar9 && bVar6) & 1)) {
                                      puVar31[-0x36] = uVar26;
                                    }
                                    if (iVar9 >= iVar52 && (iVar52 != iVar9 || !bVar6)) {
                                      puVar31[-0x24] = uVar26;
                                    }
                                    auVar55 = (auVar49 | auVar46) ^ auVar61;
                                    iVar52 = auVar55._4_4_;
                                    if (iVar52 <= iVar9 &&
                                        (iVar52 != iVar9 || auVar55._0_4_ <= iVar10)) {
                                      puVar31[-0x12] = uVar26;
                                      *puVar31 = uVar26;
                                    }
                                    uVar16 = uVar16 + 4;
                                    puVar31 = puVar31 + 0x48;
                                    pjVar32 = pjVar30;
                                  } while ((uVar22 / 0x48 + 4 & 0x7fffffffffffffc) != uVar16);
                                }
                              }
                              if (pjVar32 != pjVar14) {
                                uVar16 = (long)pjVar14 + (-0x48 - (long)pjVar32);
                                auVar5._8_8_ = 0;
                                auVar5._0_8_ = uVar16;
                                uVar40 = SUB164(auVar5 * ZEXT816(0xe38e38e38e38e38f),8);
                                uVar45 = (undefined4)(uVar16 / 0x120000000);
                                auVar58._0_8_ = CONCAT44(uVar45,uVar40);
                                auVar58._8_4_ = uVar40;
                                auVar58._12_4_ = uVar45;
                                auVar59._0_8_ = auVar58._0_8_ >> 6;
                                auVar59._8_8_ = auVar58._8_8_ >> 6;
                                puVar31 = &pjVar32[3].lyrno;
                                uVar22 = 0;
                                do {
                                  auVar50._8_4_ = (int)uVar22;
                                  auVar50._0_8_ = uVar22;
                                  auVar50._12_4_ = (int)(uVar22 >> 0x20);
                                  auVar55 = (auVar50 | auVar60) ^ auVar61;
                                  iVar9 = SUB164(auVar59 ^ auVar61,0);
                                  bVar6 = iVar9 < auVar55._0_4_;
                                  iVar10 = auVar55._4_4_;
                                  iVar52 = SUB164(auVar59 ^ auVar61,4);
                                  if ((bool)(~(iVar52 < iVar10 || iVar10 == iVar52 && bVar6) & 1)) {
                                    puVar31[-0x36] = 0xffffffff;
                                  }
                                  if (iVar52 >= iVar10 && (iVar10 != iVar52 || !bVar6)) {
                                    puVar31[-0x24] = 0xffffffff;
                                  }
                                  auVar55 = (auVar50 | auVar46) ^ auVar61;
                                  iVar10 = auVar55._4_4_;
                                  if (iVar10 <= iVar52 &&
                                      (iVar10 != iVar52 || auVar55._0_4_ <= iVar9)) {
                                    puVar31[-0x12] = 0xffffffff;
                                    *puVar31 = 0xffffffff;
                                  }
                                  uVar22 = uVar22 + 4;
                                  puVar31 = puVar31 + 0x48;
                                } while ((uVar16 / 0x48 + 4 & 0x7fffffffffffffc) != uVar22);
                              }
                            }
                            pjVar24 = pjVar24 + 1;
                          } while (pjVar24 != pjVar34);
                        }
                        uVar38 = uVar38 + 1;
                        pjVar28 = pjVar28 + 1;
                      } while (uVar38 != uVar37);
                    }
                    pjVar21 = pjVar21 + 1;
                  } while (pjVar21 != pjVar13);
                }
                pjVar20 = pjVar20 + 1;
              } while (pjVar20 != pjVar12);
            }
            pjVar18 = pjVar18 + 1;
          } while (pjVar18 != pjVar11);
          if (uVar23 != 0) {
            do {
              if ((ulong)local_d8->numrlvls != 0) {
                pjVar20 = local_d8->rlvls;
                pjVar12 = pjVar20 + local_d8->numrlvls;
                do {
                  if ((pjVar20->bands != (jpc_enc_band_t *)0x0) && (pjVar20->numprcs != 0)) {
                    uVar23 = 0;
                    do {
                      iVar10 = jpc_enc_encpkt(enc,stream,
                                              (int)((ulong)((long)local_d8 - (long)pjVar2->tcmpts)
                                                   >> 3) * -0x55ee191,
                                              (int)((ulong)((long)pjVar20 - (long)local_d8->rlvls)
                                                   >> 3) * -0x3b13b13b,uVar23,uVar26);
                      if (iVar10 != 0) {
                        return -1;
                      }
                      uVar23 = uVar23 + 1;
                    } while (uVar23 < pjVar20->numprcs);
                  }
                  pjVar20 = pjVar20 + 1;
                } while (pjVar20 != pjVar12);
              }
              local_d8 = local_d8 + 1;
              auVar46 = _DAT_0013c1d0;
              auVar60 = _DAT_00139d70;
              auVar61 = _DAT_001384e0;
            } while (local_d8 != pjVar11);
          }
        }
        uVar36 = uVar36 + 1;
      } while (uVar36 != numlyrs);
    }
    if (iVar8 < 5) {
      jas_stream_close(stream);
    }
    else {
      pjVar2 = enc->curtile;
      if (pjVar2->numlyrs != 0) {
        uVar29 = 0;
        do {
          jas_eprintf("lyrno = %02u\n",(ulong)uVar29);
          uVar23 = pjVar2->numtcmpts;
          if (uVar23 != 0) {
            pjVar18 = pjVar2->tcmpts;
            uVar26 = 0;
            do {
              uVar37 = pjVar18->numrlvls;
              if (uVar37 != 0) {
                pjVar20 = pjVar18->rlvls;
                uVar23 = 0;
                do {
                  pjVar21 = pjVar20->bands;
                  if ((pjVar21 != (jpc_enc_band_t *)0x0) &&
                     (uVar38 = pjVar20->numbands, uVar38 != 0)) {
                    uVar37 = 0;
                    do {
                      if ((pjVar21->data != (jas_matrix_t *)0x0) &&
                         (uVar33 = pjVar20->numprcs, uVar33 != 0)) {
                        pjVar28 = pjVar21->prcs;
                        uVar36 = 0;
                        do {
                          pjVar24 = pjVar28->cblks;
                          if ((pjVar24 != (jpc_enc_cblk_t *)0x0) &&
                             (uVar38 = pjVar28->numcblks, uVar38 != 0)) {
                            uVar22 = 0;
                            do {
                              if (pjVar24->numpasses != 0) {
                                puVar31 = &pjVar24->passes->lyrno;
                                uVar16 = 0;
                                do {
                                  if (*puVar31 != uVar29) break;
                                  jas_eprintf("lyrno=%02d cmptno=%02d rlvlno=%02d bandno=%02d prcno=%02d cblkno=%03d passno=%03d\n"
                                              ,(ulong)uVar29,(ulong)uVar26,(ulong)uVar23,
                                              (ulong)uVar37,uVar36,uVar22,uVar16);
                                  uVar38 = (int)uVar16 + 1;
                                  uVar16 = (ulong)uVar38;
                                  puVar31 = puVar31 + 0x12;
                                } while (uVar38 < pjVar24->numpasses);
                                uVar38 = pjVar28->numcblks;
                              }
                              uVar33 = (int)uVar22 + 1;
                              uVar22 = (ulong)uVar33;
                              pjVar24 = pjVar24 + 1;
                            } while (uVar33 < uVar38);
                            uVar33 = pjVar20->numprcs;
                          }
                          uVar38 = (int)uVar36 + 1;
                          uVar36 = (ulong)uVar38;
                          pjVar28 = pjVar28 + 1;
                        } while (uVar38 < uVar33);
                        uVar38 = pjVar20->numbands;
                      }
                      uVar37 = uVar37 + 1;
                      pjVar21 = pjVar21 + 1;
                    } while (uVar37 < uVar38);
                    uVar37 = pjVar18->numrlvls;
                  }
                  uVar23 = uVar23 + 1;
                  pjVar20 = pjVar20 + 1;
                } while (uVar23 < uVar37);
                uVar23 = pjVar2->numtcmpts;
              }
              uVar26 = uVar26 + 1;
              pjVar18 = pjVar18 + 1;
            } while (uVar26 < uVar23);
          }
          uVar29 = uVar29 + 1;
        } while (uVar29 < pjVar2->numlyrs);
      }
      jas_stream_close(stream);
      if (iVar8 < 10) {
        return 0;
      }
      jas_eprintf("finished rate allocation\n");
    }
    iVar10 = 0;
  }
  return iVar10;
}

Assistant:

int rateallocate(jpc_enc_t *enc, unsigned numlyrs, uint_fast32_t *cumlens)
{
	jpc_flt_t lo;
	jpc_flt_t hi;
	jas_stream_t *out;
	uint_fast32_t cumlen;
	jpc_flt_t thresh;
	jpc_flt_t goodthresh;
	int success;
	long pos;
	long oldpos;
	int numiters;

	jpc_enc_tcmpt_t *comp;
	jpc_enc_tcmpt_t *endcomps;
	jpc_enc_rlvl_t *lvl;
	jpc_enc_rlvl_t *endlvls;
	jpc_enc_band_t *band;
	jpc_enc_band_t *endbands;
	jpc_enc_cblk_t *cblk;
	jpc_enc_cblk_t *endcblks;
	jpc_enc_pass_t *pass;
	jpc_enc_pass_t *endpasses;
	jpc_enc_pass_t *pass1;
	jpc_flt_t mxrdslope;
	jpc_flt_t mnrdslope;
	jpc_enc_tile_t *tile;
	jpc_enc_prc_t *prc;
	unsigned prcno;

	JAS_DBGLOG(10, ("starting rate allocation\n"));

	tile = enc->curtile;

	for (unsigned lyrno = 1; lyrno < numlyrs - 1; ++lyrno) {
		if (cumlens[lyrno - 1] > cumlens[lyrno]) {
			abort();
		}
	}

	if (!(out = jas_stream_memopen(0, 0))) {
		return -1;
	}


	/* Find minimum and maximum R-D slope values. */
	mnrdslope = DBL_MAX;
	mxrdslope = 0;
	endcomps = &tile->tcmpts[tile->numtcmpts];
	for (comp = tile->tcmpts; comp != endcomps; ++comp) {
		endlvls = &comp->rlvls[comp->numrlvls];
		for (lvl = comp->rlvls; lvl != endlvls; ++lvl) {
			if (!lvl->bands) {
				continue;
			}
			endbands = &lvl->bands[lvl->numbands];
			for (band = lvl->bands; band != endbands; ++band) {
				if (!band->data) {
					continue;
				}
				for (prcno = 0, prc = band->prcs; prcno < lvl->numprcs;
				  ++prcno, ++prc) {
					if (!prc->cblks) {
						continue;
					}
					endcblks = &prc->cblks[prc->numcblks];
					for (cblk = prc->cblks; cblk != endcblks; ++cblk) {
						calcrdslopes(cblk);
						endpasses = &cblk->passes[cblk->numpasses];
						for (pass = cblk->passes; pass != endpasses; ++pass) {
							if (pass->rdslope > 0) {
								if (pass->rdslope < mnrdslope) {
									mnrdslope = pass->rdslope;
								}
								if (pass->rdslope > mxrdslope) {
									mxrdslope = pass->rdslope;
								}
							}
						}
					}
				}
			}
		}
	}
	JAS_DBGLOG(10, ("min rdslope = %f max rdslope = %f\n", mnrdslope,
	  mxrdslope));

	jpc_init_t2state(enc, 1);

	for (unsigned lyrno = 0; lyrno < numlyrs; ++lyrno) {

		lo = mnrdslope;
		hi = mxrdslope;

		success = 0;
		goodthresh = 0;
		numiters = 0;

		do {

			cumlen = cumlens[lyrno];
			if (cumlen == UINT_FAST32_MAX) {
				/* Only the last layer can be free of a rate
				  constraint (e.g., for lossless coding). */
				assert(lyrno == numlyrs - 1);
				goodthresh = -1;
				success = 1;
				break;
			}

			thresh = (lo + hi) / 2;

			/* Save the tier 2 coding state. */
			jpc_save_t2state(enc);
			oldpos = jas_stream_tell(out);
			assert(oldpos >= 0);

			/* Assign all passes with R-D slopes greater than or
			  equal to the current threshold to this layer. */
			endcomps = &tile->tcmpts[tile->numtcmpts];
			for (comp = tile->tcmpts; comp != endcomps; ++comp) {
				endlvls = &comp->rlvls[comp->numrlvls];
				for (lvl = comp->rlvls; lvl != endlvls; ++lvl) {
					if (!lvl->bands) {
						continue;
					}
					endbands = &lvl->bands[lvl->numbands];
					for (band = lvl->bands; band != endbands; ++band) {
						if (!band->data) {
							continue;
						}
						for (prcno = 0, prc = band->prcs; prcno < lvl->numprcs;
						  ++prcno, ++prc) {
							if (!prc->cblks) {
								continue;
							}
							endcblks = &prc->cblks[prc->numcblks];
							for (cblk = prc->cblks; cblk != endcblks; ++cblk) {
								if (cblk->curpass) {
									endpasses = &cblk->passes[cblk->numpasses];
									pass1 = cblk->curpass;
									for (pass = cblk->curpass; pass !=
									  endpasses; ++pass) {
										if (pass->rdslope >= thresh) {
											pass1 = &pass[1];
										}
									}
									for (pass = cblk->curpass; pass != pass1;
									  ++pass) {
										pass->lyrno = lyrno;
									}
									for (; pass != endpasses; ++pass) {
										pass->lyrno = -1;
									}
								}
							}
						}
					}
				}
			}

			/* Perform tier 2 coding. */
			endcomps = &tile->tcmpts[tile->numtcmpts];
			for (comp = tile->tcmpts; comp != endcomps; ++comp) {
				endlvls = &comp->rlvls[comp->numrlvls];
				for (lvl = comp->rlvls; lvl != endlvls; ++lvl) {
					if (!lvl->bands) {
						continue;
					}
					for (prcno = 0; prcno < lvl->numprcs; ++prcno) {
						if (jpc_enc_encpkt(enc, out, comp - tile->tcmpts,
						  lvl - comp->rlvls, prcno, lyrno)) {
							return -1;
						}
					}
				}
			}

			pos = jas_stream_tell(out);

			/* Check the rate constraint. */
			assert(pos >= 0);
			if ((uint_fast32_t)pos > cumlen) {
				/* The rate is too high. */
				lo = thresh;
			} else if ((uint_fast32_t)pos <= cumlen) {
				/* The rate is low enough, so try higher. */
				hi = thresh;
				if (!success || thresh < goodthresh) {
					goodthresh = thresh;
					success = 1;
				}
			}

			/* Save the tier 2 coding state. */
			jpc_restore_t2state(enc);
			if (jas_stream_seek(out, oldpos, SEEK_SET) < 0) {
				abort();
			}

			JAS_DBGLOG(10, ("maxlen=%08ld actuallen=%08ld thresh=%f\n",
			  cumlen, pos, thresh));

			++numiters;
		} while (lo < hi - 1e-3 && numiters < 32);

		if (!success) {
			jas_eprintf("warning: empty layer generated\n");
		}

		JAS_DBGLOG(10, ("success %d goodthresh %f\n", success, goodthresh));

		/* Assign all passes with R-D slopes greater than or
		  equal to the selected threshold to this layer. */
		endcomps = &tile->tcmpts[tile->numtcmpts];
		for (comp = tile->tcmpts; comp != endcomps; ++comp) {
			endlvls = &comp->rlvls[comp->numrlvls];
			for (lvl = comp->rlvls; lvl != endlvls; ++lvl) {
				if (!lvl->bands) {
					continue;
				}
				endbands = &lvl->bands[lvl->numbands];
				for (band = lvl->bands; band != endbands; ++band) {
					if (!band->data) {
						continue;
					}
					for (prcno = 0, prc = band->prcs; prcno < lvl->numprcs;
					  ++prcno, ++prc) {
						if (!prc->cblks) {
							continue;
						}
						endcblks = &prc->cblks[prc->numcblks];
						for (cblk = prc->cblks; cblk != endcblks; ++cblk) {
							if (cblk->curpass) {
								endpasses = &cblk->passes[cblk->numpasses];
								pass1 = cblk->curpass;
								if (success) {
									for (pass = cblk->curpass; pass !=
									  endpasses; ++pass) {
										if (pass->rdslope >= goodthresh) {
											pass1 = &pass[1];
										}
									}
								}
								for (pass = cblk->curpass; pass != pass1;
								  ++pass) {
									pass->lyrno = lyrno;
								}
								for (; pass != endpasses; ++pass) {
									pass->lyrno = -1;
								}
							}
						}
					}
				}
			}
		}

		/* Perform tier 2 coding. */
		endcomps = &tile->tcmpts[tile->numtcmpts];
		for (comp = tile->tcmpts; comp != endcomps; ++comp) {
			endlvls = &comp->rlvls[comp->numrlvls];
			for (lvl = comp->rlvls; lvl != endlvls; ++lvl) {
				if (!lvl->bands) {
					continue;
				}
				for (prcno = 0; prcno < lvl->numprcs; ++prcno) {
					if (jpc_enc_encpkt(enc, out, comp - tile->tcmpts,
					  lvl - comp->rlvls, prcno, lyrno)) {
						return -1;
					}
				}
			}
		}
	}

	if (jas_getdbglevel() >= 5) {
		dump_layeringinfo(enc);
	}

	jas_stream_close(out);

	JAS_DBGLOG(10, ("finished rate allocation\n"));

	return 0;
}